

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderInvarianceTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_1::InvarianceTest::deinit(InvarianceTest *this)

{
  ShaderProgram *pSVar1;
  int iVar2;
  undefined4 extraout_var;
  
  pSVar1 = this->m_shader0;
  if (pSVar1 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(pSVar1);
    operator_delete(pSVar1,0xd0);
  }
  pSVar1 = this->m_shader1;
  if (pSVar1 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(pSVar1);
    operator_delete(pSVar1,0xd0);
  }
  this->m_shader0 = (ShaderProgram *)0x0;
  this->m_shader1 = (ShaderProgram *)0x0;
  if (this->m_arrayBuf != 0) {
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x438))(1,&this->m_arrayBuf);
    this->m_arrayBuf = 0;
  }
  return;
}

Assistant:

void InvarianceTest::deinit (void)
{
	delete m_shader0;
	delete m_shader1;

	m_shader0 = DE_NULL;
	m_shader1 = DE_NULL;

	if (m_arrayBuf)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_arrayBuf);
		m_arrayBuf = 0;
	}
}